

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsRecover(octet *s,size_t count,size_t len,octet *si,octet *m0,octet *mi)

{
  bool_t bVar1;
  int iVar2;
  ulong n_00;
  size_t n_01;
  size_t sVar3;
  word *c_00;
  ulong uVar4;
  long lVar5;
  word *a;
  word *a_00;
  void *in_RCX;
  ulong uVar6;
  size_t in_RDX;
  ulong in_RSI;
  void *in_RDI;
  void *in_R8;
  void *in_R9;
  void *stack;
  word *t;
  word *c;
  word *v;
  word *u;
  word *d;
  word *g;
  word *f;
  void *state;
  size_t deep;
  size_t i;
  size_t n;
  void *in_stack_ffffffffffffff08;
  u64 *in_stack_ffffffffffffff10;
  word *b;
  size_t in_stack_ffffffffffffff20;
  word *a_01;
  size_t in_stack_ffffffffffffff28;
  word *a_02;
  void *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  word *in_stack_ffffffffffffff58;
  word *a_03;
  word *r;
  word *a_04;
  word *db;
  word *da;
  word *d_00;
  word *stack_00;
  size_t local_50;
  ulong local_48;
  
  if (((((in_RDX != 0x10) && (in_RDX != 0x18)) && (in_RDX != 0x20)) ||
      ((in_RSI == 0 || (bVar1 = memIsValid(in_RCX,in_RSI * in_RDX), bVar1 == 0)))) ||
     ((bVar1 = memIsValid(in_R8,in_RDX), bVar1 == 0 ||
      ((bVar1 = memIsValid(in_R9,in_RDX * in_RSI), bVar1 == 0 ||
       (bVar1 = memIsValid(in_RDI,in_RDX), bVar1 == 0)))))) {
    return 0x6d;
  }
  n_00 = in_RDX + 7 >> 3;
  n_01 = ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  sVar3 = ppMod_deep((size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
  local_50 = utilMax(2,n_01,sVar3);
  for (local_48 = 1; local_48 < in_RSI; local_48 = local_48 + 1) {
    sVar3 = ppExGCD_deep(n_00 + 1,local_48 * n_00 + 1);
    in_stack_ffffffffffffff48 =
         (void *)ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff50 = ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff58 =
         (word *)ppMul_deep(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff08 =
         (void *)ppMod_deep((size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    local_50 = utilMax(6,local_50,sVar3,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff58);
  }
  c_00 = (word *)(n_00 * 2 + in_RSI * n_00 + (in_RSI - 1) * n_00 + (in_RSI - 1) * n_00 + 5 +
                 (in_RSI * 2 + -1) * n_00);
  uVar4 = (in_RSI * 2 + -2) * n_00;
  uVar6 = (in_RSI + 1) * n_00;
  if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
    lVar5 = in_RSI + 1;
  }
  else {
    lVar5 = in_RSI * 2 + -2;
  }
  a_02 = (word *)(lVar5 * n_00);
  a = (word *)blobCreate((size_t)in_stack_ffffffffffffff08);
  if (a == (word *)0x0) {
    return 0x6e;
  }
  a_00 = a + n_00 + 1;
  d_00 = a_00 + in_RSI * n_00 + 1;
  da = d_00 + (in_RSI - 1) * n_00 + 1;
  db = da + (in_RSI - 1) * n_00 + 1;
  a_04 = db + n_00 + 1;
  a_01 = a_04 + (in_RSI * 2 + -1) * n_00;
  uVar4 = (in_RSI * 2 + -2) * n_00;
  uVar6 = (in_RSI + 1) * n_00;
  if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
    lVar5 = in_RSI + 1;
  }
  else {
    lVar5 = in_RSI * 2 + -2;
  }
  b = (word *)(lVar5 * n_00);
  a_03 = a_01 + (long)b;
  r = a_01;
  stack_00 = a;
  u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x1470d2);
  u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x1470ef);
  a_00[n_00] = 1;
  a[n_00] = 1;
  local_48 = 1;
  while( true ) {
    if (in_RSI <= local_48) {
      u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x147515);
      a[n_00] = 1;
      ppMod(r,a_03,n_01,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
            in_stack_ffffffffffffff48);
      u64To(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,(u64 *)0x147580);
      blobClose((blob_t)0x14758d);
      return 0;
    }
    u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x147172);
    in_stack_ffffffffffffff10 = a_03;
    in_stack_ffffffffffffff08 = (void *)(local_48 * n_00 + 1);
    a_03 = in_stack_ffffffffffffff10;
    ppExGCD(d_00,da,db,a_04,(size_t)r,in_stack_ffffffffffffff10,(size_t)a,stack_00);
    iVar2 = wwCmpW(a_01,(size_t)b,(word)in_stack_ffffffffffffff10);
    if (iVar2 != 0) break;
    ppMul(c_00,a_02,(size_t)a_01,b,(size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    ppMul(c_00,a_02,(size_t)a_01,b,(size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    wwXor2(a_04 + n_00,r,local_48 * 2 * n_00);
    u64From(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x1472ea);
    ppMul(c_00,a_02,(size_t)a_01,b,(size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    ppMul(c_00,a_02,(size_t)a_01,b,(size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    wwXor2(r + local_48 * n_00,d_00,n_00 << 1);
    wwXor2(a_04,r,(local_48 + 2) * n_00);
    ppMul(c_00,a_02,(size_t)a_01,b,(size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    wwXor2(r + n_00,a_00,local_48 * n_00);
    wwXor2(r + local_48 * n_00,a,n_00);
    wwCopy(a_00,r,(local_48 + 1) * n_00);
    a_00[(local_48 + 1) * n_00] = 1;
    ppMod(r,a_03,n_01,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
    ;
    local_48 = local_48 + 1;
  }
  blobClose((blob_t)0x147204);
  return 0x1f9;
}

Assistant:

err_t belsRecover(octet s[], size_t count, size_t len, const octet si[], 
	const octet m0[], const octet mi[])
{
	size_t n, i, deep;
	void* state;
	word* f;
	word* g;
	word* d;
	word* u;
	word* v;
	word* c;
	word* t;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || count == 0 || 
		!memIsValid(si, count * len) || !memIsValid(m0, len) || 
		!memIsValid(mi, len * count) || !memIsValid(s, len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// расчет глубины стека
	n = W_OF_O(len);
	deep = utilMax(2, 
		ppMul_deep(n, n), 
		ppMod_deep(count * n, n + 1));
	for (i = 1; i < count; ++i)
		deep = utilMax(6, 
			deep, 
			ppExGCD_deep(n + 1, i * n + 1),
			ppMul_deep(i * n, i * n),
			ppMul_deep(2 * i * n, n),
			ppMul_deep(2 * n, i * n),
			ppMod_deep((2 * i + 1) * n, (i + 1) * n + 1));
	deep += O_OF_W(
		n + 1 +			
		count * n + 1 +
		(count - 1) * n + 1 +
		(count - 1) * n + 1 +
		n + 1 +
		(2 * count - 1) * n + 
		MAX2((2 * count - 2) * n, (count + 1) * n));
	// создать состояние
	state = blobCreate(deep);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	g = f + n + 1;
	d = g + count * n + 1;
	u = d + (count - 1) * n + 1;
	v = u + (count - 1) * n + 1;
	c = v + n + 1;
	t = c + (2 * count - 1) * n;
	stack = t + MAX2((2 * count - 2) * n, (count + 1) * n);
	// [n]c(x) <- s1(x)
	wwFrom(c, si, len);
	// [n + 1]g(x) <- x^l + m1(x)
	wwFrom(g, mi, len), g[n] = 1;
	// цикл по пользователям
	for (f[n] = 1, i = 1; i < count; ++i)
	{
		// [n + 1]f(x) <- x^l + mi(x)
		wwFrom(f, mi + i * len, len);
		// найти d(x) = \gcd(f(x), g(x)) и коэфф. Безу [i * n]u(x), [n]v(x)
		ppExGCD(d, u, v, f, n + 1, g, i * n + 1, stack);
		ASSERT(u[i * n] == 0 && v[n] == 0);
		// d(x) != 1? 
		if (wwCmpW(d, i * n + 1, 1) != 0)
		{
			blobClose(state);
			return ERR_BAD_PUBKEY;
		}
		// [2 * i * n]c(x) <- u(x)f(x)c(x)
		// (с помощью [2 * i * n]t)
		ppMul(t, u, i * n, c, i * n, stack);
		ppMul(c, t, 2 * i * n, f, n, stack);
		wwXor2(c + n, t, 2 * i * n);
		// c(x) <- c(x) + v(x)g(x)si(x)
		// (с помощью [2 * n]d и [(i + 2) * n]t)
		wwFrom(t, si + i * len, len);
		ppMul(d, v, n, t, n, stack);
		ppMul(t, d, 2 * n, g, i * n, stack);
		wwXor2(t + i * n, d, 2 * n);
		wwXor2(c, t, (i + 2) * n);
		// [(i + 1) * n + 1]g(x) <- g(x)f(x)
		// (с помощью [(i + 1) * n]t)
		ppMul(t, f, n, g, i * n, stack);
		wwXor2(t + n, g, i * n);
		wwXor2(t + i * n, f, n);
		wwCopy(g, t, (i + 1) * n);
		g[(i + 1) * n] = 1;
		// [(i + 1) * n]c(x) <- c(x) mod g(x)
		ppMod(c, c, (2 * i + 1) * n, g, (i + 1) * n + 1, stack);
		ASSERT(c[(i + 1) * n] == 0);
	}
	// [n]s(x) <- c(x) mod (x^l + m0(x))
	wwFrom(f, m0, len), f[n] = 1;
	ppMod(c, c, count * n, f, n + 1, stack);
	ASSERT(c[n] == 0);
	wwTo(s, len, c);
	// завершение
	blobClose(state);
	return ERR_OK;
}